

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_avx2
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  void *pvVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  Mat *pMVar13;
  ulong uVar14;
  int kk;
  ulong uVar15;
  char *pcVar16;
  int m;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  ulong local_130;
  undefined8 local_110;
  Mat local_108;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  Mat *local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  int local_84;
  int local_80;
  uint local_7c;
  Mat local_78;
  
  local_a8 = kernel;
  get_optimal_tile_mnk_int8(outch,0,inch,(int *)&local_7c,&local_80,&local_84,opt->num_threads);
  local_c0 = (ulong)local_7c;
  uVar12 = (long)(int)(outch + local_7c + -1) / (long)(int)local_7c;
  iVar9 = (int)uVar12;
  uVar19 = (ulong)local_84;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_b8 = (ulong)(uint)outch;
  Mat::create(&local_78,local_84 * local_7c * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
  Mat::create(AT,local_84 * local_7c,0x10,(inch + local_84 + -1) / local_84,iVar9,2,(Allocator *)0x0
             );
  if (0 < iVar9) {
    local_a0 = (long)inch;
    local_b0 = uVar12 & 0xffffffff;
    local_130 = 0;
    local_98 = uVar19;
    do {
      iVar9 = get_omp_thread_num();
      if (0 < inch) {
        local_110 = (Mat *)((long)iVar9 * local_78.cstep *
                            CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                           (long)local_78.data);
        local_90 = local_130 * local_c0;
        uVar11 = (int)local_b8 - (int)(local_130 * local_c0);
        uVar12 = (ulong)uVar11;
        if ((int)local_c0 < (int)uVar11) {
          uVar12 = local_c0 & 0xffffffff;
        }
        uVar18 = 0;
        uVar10 = uVar19;
        do {
          uVar19 = local_98;
          uVar11 = inch - (int)uVar18;
          uVar14 = (ulong)uVar11;
          if ((int)uVar10 < (int)uVar11) {
            uVar14 = uVar10 & 0xffffffff;
          }
          if (0 < (int)uVar12) {
            pvVar7 = local_a8->data;
            uVar10 = 0;
            pMVar13 = local_110;
            do {
              if (0 < (int)uVar14) {
                uVar15 = 0;
                do {
                  pcVar16 = (char *)((long)pvVar7 +
                                    (uVar15 + uVar18) * 9 +
                                    (long)(((int)local_90 + (int)uVar10) * inch * 9));
                  lVar17 = 0;
                  do {
                    cVar1 = *pcVar16;
                    cVar2 = pcVar16[1];
                    cVar3 = pcVar16[2];
                    *(short *)((long)&local_108.data + lVar17 * 2) = cVar1 * 2;
                    *(short *)((long)&local_108.data + lVar17 * 2 + 6) =
                         (short)cVar2 + (short)cVar1 + (short)cVar3;
                    *(short *)((long)&local_108.refcount + lVar17 * 2 + 4) =
                         ((short)cVar1 - (short)cVar2) + (short)cVar3;
                    *(short *)((long)&local_108.elemsize + lVar17 * 2 + 2) =
                         (short)cVar3 + (short)cVar3;
                    pcVar16 = pcVar16 + 3;
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  lVar17 = 4;
                  do {
                    sVar4 = *(short *)((long)&local_110 + lVar17 + 4);
                    sVar5 = *(short *)((long)&local_110 + lVar17 + 6);
                    sVar6 = *(short *)((long)&local_108.data + lVar17);
                    *(short *)&pMVar13->data = sVar4 * 2;
                    *(short *)((long)&pMVar13->data + 2) = sVar5 + sVar4 + sVar6;
                    *(short *)((long)&pMVar13->data + 4) = (sVar4 - sVar5) + sVar6;
                    *(short *)((long)&pMVar13->data + 6) = sVar6 * 2;
                    pMVar13 = (Mat *)&pMVar13->refcount;
                    lVar17 = lVar17 + 6;
                  } while (lVar17 != 0x1c);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar14);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar12);
          }
          local_108.w = AT->w;
          local_108.elemsize = AT->elemsize;
          local_108.h = AT->h;
          local_108.elempack = AT->elempack;
          local_108.allocator = AT->allocator;
          local_108.cstep = (long)local_108.h * (long)local_108.w;
          local_108.data =
               (void *)((long)AT->data +
                       local_108.elemsize * local_108.cstep *
                       (long)(int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 |
                                         uVar18 & 0xffffffff) / (long)(int)local_98) +
                       AT->cstep * local_130 * local_108.elemsize);
          local_108.refcount = (int *)0x0;
          local_108.dims = 2;
          local_108.d = 1;
          local_108.c = 1;
          pack_A_tile_int8(local_110,&local_108,0x10,(int)uVar12,(int)uVar14);
          uVar18 = uVar18 + uVar19;
          uVar10 = uVar19;
        } while ((long)uVar18 < local_a0);
      }
      local_130 = local_130 + 1;
    } while (local_130 != local_b0);
  }
  piVar8 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd23_transform_kernel_int8_avx2(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd23_transform_kernel_int8(kernel, AT, inch, outch, opt);
}